

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O2

void visit_listener_state_changed_floatv
               (void *userdata,ALCcontext *ctx,ALenum param,uint32 numfloats,ALfloat *values)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (dump_state_changes == '\x01') {
    pcVar1 = ctxString(ctx);
    pcVar2 = alenumString(param);
    printf("<<< LISTENER STATE CHANGE: ctx=%s param=%s values={",pcVar1,pcVar2);
    for (uVar3 = 0; numfloats != uVar3; uVar3 = uVar3 + 1) {
      pcVar1 = ",";
      if (uVar3 == 0) {
        pcVar1 = "";
      }
      printf("%s %f",(double)values[uVar3],pcVar1);
    }
    pcVar1 = " ";
    if (numfloats == 0) {
      pcVar1 = "";
    }
    printf("%s} >>>\n",pcVar1);
    return;
  }
  return;
}

Assistant:

void visit_listener_state_changed_floatv(void *userdata, ALCcontext *ctx, const ALenum param, const uint32 numfloats, const ALfloat *values)
{
    if (dump_state_changes) {
        uint32 i;
        printf("<<< LISTENER STATE CHANGE: ctx=%s param=%s values={", ctxString(ctx), alenumString(param));
        for (i = 0; i < numfloats; i++) {
            printf("%s %f", i > 0 ? "," : "", values[i]);
        }
        printf("%s} >>>\n", numfloats > 0 ? " " : "");
    }
}